

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3_test.c
# Opt level: O0

int sm3_test_case(void)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int i;
  uint8_t h2 [32];
  uint8_t h1 [32];
  int ret;
  uint local_4c;
  undefined1 local_48 [32];
  undefined1 local_28 [36];
  int local_4;
  
  local_4 = 0;
  local_4c = 0;
  while( true ) {
    if (7 < local_4c) {
      printf("sm3 test case PASS \n");
      return 1;
    }
    pcVar1 = sm3_test_vec[(int)local_4c].in;
    sVar3 = strlen(sm3_test_vec[(int)local_4c].in);
    SM3_once(pcVar1,sVar3 & 0xffffffff,local_28);
    hex_to_u8(sm3_test_vec[(int)local_4c].hash,0x40,local_48);
    iVar2 = memcmp(local_28,local_48,0x20);
    if (iVar2 != 0) break;
    local_4c = local_4c + 1;
  }
  printf("sm3 test case %d failed\n",(ulong)(local_4c + 1));
  return local_4;
}

Assistant:

int sm3_test_case()
{
    int ret = GML_ERROR;
    uint8_t h1[32];
    uint8_t h2[32];

    for (int i = 0; i < sizeof(sm3_test_vec) / sizeof(SM3_TEST_VECTOR); i++) {
        SM3_once((uint8_t*)sm3_test_vec[i].in, strlen(sm3_test_vec[i].in), h1);
        hex_to_u8((uint8_t*)sm3_test_vec[i].hash, 64, h2);
        if (memcmp(h1, h2, 32) != 0) {
            printf("sm3 test case %d failed\n", i+1);
            goto end;
        }
    }

    printf("sm3 test case PASS \n");
    ret = GML_OK;
end:
    return ret;
}